

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_ownership(archive_write_disk *a)

{
  undefined4 __owner;
  undefined4 __owner_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint *puVar4;
  archive *in_RDI;
  wchar_t local_4;
  
  if ((in_RDI[1].archive_format_name == (char *)0x0) ||
     (in_RDI[1].archive_format_name == *(char **)&in_RDI[4].file_count)) {
    if ((-1 < (int)in_RDI[4].state) &&
       (__owner = in_RDI[4].file_count,
       iVar3 = fchown(in_RDI[4].state,__owner,(__gid_t)in_RDI[4].error), iVar3 == 0)) {
      *(uint *)&in_RDI[3].sconv = *(uint *)&in_RDI[3].sconv & 0xf5fffffe;
      return L'\0';
    }
    __owner_00 = in_RDI[4].file_count;
    iVar3 = lchown((char *)in_RDI[3].error_string.length,__owner_00,(__gid_t)in_RDI[4].error);
    if (iVar3 == 0) {
      *(uint *)&in_RDI[3].sconv = *(uint *)&in_RDI[3].sconv & 0xf5fffffe;
      local_4 = L'\0';
    }
    else {
      puVar4 = (uint *)__errno_location();
      uVar2._0_4_ = in_RDI[4].file_count;
      uVar2._4_4_ = in_RDI[4].archive_error_number;
      archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t set user=%jd/group=%jd for %s",uVar2,
                        in_RDI[4].error,in_RDI[3].error_string.length);
      local_4 = L'\xffffffec';
    }
  }
  else {
    puVar4 = (uint *)__errno_location();
    uVar1._0_4_ = in_RDI[4].file_count;
    uVar1._4_4_ = in_RDI[4].archive_error_number;
    archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t set UID=%jd",uVar1);
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
set_ownership(struct archive_write_disk *a)
{
#ifndef __CYGWIN__
/* unfortunately, on win32 there is no 'root' user with uid 0,
   so we just have to try the chown and see if it works */

	/* If we know we can't change it, don't bother trying. */
	if (a->user_uid != 0  &&  a->user_uid != a->uid) {
		archive_set_error(&a->archive, errno,
		    "Can't set UID=%jd", (intmax_t)a->uid);
		return (ARCHIVE_WARN);
	}
#endif

#ifdef HAVE_FCHOWN
	/* If we have an fd, we can avoid a race. */
	if (a->fd >= 0 && fchown(a->fd, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#endif

	/* We prefer lchown() but will use chown() if that's all we have. */
	/* Of course, if we have neither, this will always fail. */
#ifdef HAVE_LCHOWN
	if (lchown(a->name, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#elif HAVE_CHOWN
	if (!S_ISLNK(a->mode) && chown(a->name, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#endif

	archive_set_error(&a->archive, errno,
	    "Can't set user=%jd/group=%jd for %s",
	    (intmax_t)a->uid, (intmax_t)a->gid, a->name);
	return (ARCHIVE_WARN);
}